

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvlat1.cpp
# Opt level: O0

void ucnv_Latin1FromUTF8(UConverterFromUnicodeArgs *pFromUArgs,UConverterToUnicodeArgs *pToUArgs,
                        UErrorCode *pErrorCode)

{
  uint8_t uVar1;
  byte bVar2;
  UConverter *pUVar3;
  byte *pbVar4;
  byte bVar5;
  UBool UVar6;
  int local_54;
  int local_50;
  uint local_48;
  uint8_t t1;
  int iStack_44;
  uint8_t b;
  UChar32 c;
  int32_t targetCapacity;
  uint8_t *target;
  uint8_t *sourceLimit;
  uint8_t *source;
  UConverter *utf8;
  UErrorCode *pErrorCode_local;
  UConverterToUnicodeArgs *pToUArgs_local;
  UConverterFromUnicodeArgs *pFromUArgs_local;
  
  pUVar3 = pToUArgs->converter;
  sourceLimit = (uint8_t *)pToUArgs->source;
  target = (uint8_t *)pToUArgs->sourceLimit;
  pbVar4 = (byte *)pFromUArgs->target;
  iStack_44 = (int)pFromUArgs->targetLimit - (int)pFromUArgs->target;
  if (pUVar3->toULength < '\x01') {
    local_48 = 0;
  }
  else {
    local_48 = pUVar3->toUnicodeStatus;
  }
  _c = pbVar4;
  if ((local_48 != 0) && (sourceLimit < target)) {
    if (iStack_44 == 0) {
      *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
      return;
    }
    if ((((int)local_48 < 0xc2) || (0xc3 < (int)local_48)) ||
       (uVar1 = *sourceLimit, 0x3f < (byte)(uVar1 + 0x80))) {
      *pErrorCode = U_USING_DEFAULT_WARNING;
      return;
    }
    sourceLimit = sourceLimit + 1;
    _c = pbVar4 + 1;
    *pbVar4 = (byte)((local_48 & 3) << 6) | uVar1 + 0x80;
    iStack_44 = iStack_44 + -1;
    pUVar3->toUnicodeStatus = 0;
    pUVar3->toULength = '\0';
  }
  if ((sourceLimit < target) && ((byte)(target[-1] + 0x3e) < 0x33)) {
    target = target + -1;
  }
  do {
    if (target <= sourceLimit) {
LAB_0018e7cf:
      UVar6 = U_SUCCESS(*pErrorCode);
      if ((UVar6 != '\0') && (sourceLimit < pToUArgs->sourceLimit)) {
        bVar2 = *sourceLimit;
        pUVar3->toUBytes[0] = bVar2;
        pUVar3->toUnicodeStatus = (uint)bVar2;
        pUVar3->toULength = '\x01';
        if ((bVar2 & 0x80) == 0) {
          local_50 = 1;
        }
        else {
          if ((byte)(bVar2 + 0x3e) < 0x33) {
            local_54 = (uint)(0xdf < bVar2) + (uint)(0xef < bVar2) + 2;
          }
          else {
            local_54 = 0;
          }
          local_50 = local_54;
        }
        pUVar3->mode = local_50;
        sourceLimit = sourceLimit + 1;
      }
      pToUArgs->source = (char *)sourceLimit;
      pFromUArgs->target = (char *)_c;
      return;
    }
    if (iStack_44 < 1) {
      *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
      goto LAB_0018e7cf;
    }
    bVar2 = *sourceLimit;
    if ((bVar2 & 0x80) == 0) {
      *_c = bVar2;
      sourceLimit = sourceLimit + 1;
    }
    else {
      if (((bVar2 < 0xc2) || (0xc3 < bVar2)) || (bVar5 = sourceLimit[1] + 0x80, 0x3f < bVar5)) {
        pToUArgs->source = (char *)sourceLimit;
        pFromUArgs->target = (char *)_c;
        *pErrorCode = U_USING_DEFAULT_WARNING;
        return;
      }
      sourceLimit = sourceLimit + 2;
      *_c = bVar2 << 6 | bVar5;
    }
    _c = _c + 1;
    iStack_44 = iStack_44 + -1;
  } while( true );
}

Assistant:

static void U_CALLCONV
ucnv_Latin1FromUTF8(UConverterFromUnicodeArgs *pFromUArgs,
                    UConverterToUnicodeArgs *pToUArgs,
                    UErrorCode *pErrorCode) {
    UConverter *utf8;
    const uint8_t *source, *sourceLimit;
    uint8_t *target;
    int32_t targetCapacity;

    UChar32 c;
    uint8_t b, t1;

    /* set up the local pointers */
    utf8=pToUArgs->converter;
    source=(uint8_t *)pToUArgs->source;
    sourceLimit=(uint8_t *)pToUArgs->sourceLimit;
    target=(uint8_t *)pFromUArgs->target;
    targetCapacity=(int32_t)(pFromUArgs->targetLimit-pFromUArgs->target);

    /* get the converter state from the UTF-8 UConverter */
    if (utf8->toULength > 0) {
        c=(UChar32)utf8->toUnicodeStatus;
    } else {
        c = 0;
    }
    if(c!=0 && source<sourceLimit) {
        if(targetCapacity==0) {
            *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
            return;
        } else if(c>=0xc2 && c<=0xc3 && (t1=(uint8_t)(*source-0x80)) <= 0x3f) {
            ++source;
            *target++=(uint8_t)(((c&3)<<6)|t1);
            --targetCapacity;

            utf8->toUnicodeStatus=0;
            utf8->toULength=0;
        } else {
            /* complicated, illegal or unmappable input: fall back to the pivoting implementation */
            *pErrorCode=U_USING_DEFAULT_WARNING;
            return;
        }
    }

    /*
     * Make sure that the last byte sequence before sourceLimit is complete
     * or runs into a lead byte.
     * In the conversion loop compare source with sourceLimit only once
     * per multi-byte character.
     * For Latin-1, adjust sourceLimit only for 1 trail byte because
     * the conversion loop handles at most 2-byte sequences.
     */
    if(source<sourceLimit && U8_IS_LEAD(*(sourceLimit-1))) {
        --sourceLimit;
    }

    /* conversion loop */
    while(source<sourceLimit) {
        if(targetCapacity>0) {
            b=*source++;
            if(U8_IS_SINGLE(b)) {
                /* convert ASCII */
                *target++=(uint8_t)b;
                --targetCapacity;
            } else if( /* handle U+0080..U+00FF inline */
                       b>=0xc2 && b<=0xc3 &&
                       (t1=(uint8_t)(*source-0x80)) <= 0x3f
            ) {
                ++source;
                *target++=(uint8_t)(((b&3)<<6)|t1);
                --targetCapacity;
            } else {
                /* complicated, illegal or unmappable input: fall back to the pivoting implementation */
                pToUArgs->source=(char *)(source-1);
                pFromUArgs->target=(char *)target;
                *pErrorCode=U_USING_DEFAULT_WARNING;
                return;
            }
        } else {
            /* target is full */
            *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
            break;
        }
    }

    /*
     * The sourceLimit may have been adjusted before the conversion loop
     * to stop before a truncated sequence.
     * If so, then collect the truncated sequence now.
     * For Latin-1, there is at most exactly one lead byte because of the
     * smaller sourceLimit adjustment logic.
     */
    if(U_SUCCESS(*pErrorCode) && source<(sourceLimit=(uint8_t *)pToUArgs->sourceLimit)) {
        utf8->toUnicodeStatus=utf8->toUBytes[0]=b=*source++;
        utf8->toULength=1;
        utf8->mode=U8_COUNT_BYTES(b);
    }

    /* write back the updated pointers */
    pToUArgs->source=(char *)source;
    pFromUArgs->target=(char *)target;
}